

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O0

void __thiscall ExternalCodeEditor::~ExternalCodeEditor(ExternalCodeEditor *this)

{
  ExternalCodeEditor *this_local;
  
  if (G_debug != 0) {
    printf("ExternalCodeEditor() DTOR CALLED (this=%p, pid=%ld)\n",this,(long)this->pid_);
  }
  close_editor(this);
  set_filename(this,(char *)0x0);
  return;
}

Assistant:

ExternalCodeEditor::~ExternalCodeEditor() {
  if ( G_debug )
    printf("ExternalCodeEditor() DTOR CALLED (this=%p, pid=%ld)\n",
           (void*)this, (long)pid_);
  close_editor();   // close editor, delete tmp file
  set_filename(0);  // free()s filename
}